

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxStructMember::Resolve(FxStructMember *this,FCompileContext *ctx)

{
  PField *pPVar1;
  FxExpression *pFVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  FxClassDefaults *this_00;
  undefined4 extraout_var_00;
  PField *pPVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  FxConstant *pFVar7;
  FxBitOp *this_01;
  undefined4 extraout_var_04;
  char *pcVar8;
  PClass *pPVar9;
  FxExpression *local_b8;
  FxExpression *x_4;
  int bits;
  FxLocalVariable *locvar;
  FxExpression *x_3;
  PField *local_90;
  PField *newfield_2;
  PField *parentfield_2;
  FxExpression *x_2;
  PField *local_70;
  PField *newfield_1;
  PField *parentfield_1;
  FxExpression *x_1;
  PField *local_50;
  PField *newfield;
  PField *parentfield;
  PPointer *ptrtype;
  FxClassDefaults *local_28;
  FxExpression *x;
  FCompileContext *ctx_local;
  FxStructMember *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    x = (FxExpression *)ctx;
    ctx_local = (FCompileContext *)this;
    if (this->classx != (FxExpression *)0x0) {
      iVar4 = (*this->classx->_vptr_FxExpression[2])(this->classx,ctx);
      this->classx = (FxExpression *)CONCAT44(extraout_var,iVar4);
    }
    if (this->classx == (FxExpression *)0x0) {
      if (this != (FxStructMember *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxStructMember *)0x0;
    }
    else {
      bVar3 = FName::operator==((FName *)&(this->membervar->super_PSymbol).super_PTypeBase.
                                          super_DObject.field_0x24,NAME_Default);
      if (bVar3) {
        bVar3 = DObject::IsKindOf((DObject *)this->classx->ValueType,
                                  PPointer::RegistrationInfo.MyClass);
        if ((bVar3) &&
           (pPVar9 = AActor::RegistrationInfo.MyClass,
           bVar3 = DObject::IsKindOf((DObject *)
                                     this->classx->ValueType[1].super_PTypeBase.super_DObject.
                                     _vptr_DObject,AActor::RegistrationInfo.MyClass), bVar3)) {
          this_00 = (FxClassDefaults *)
                    FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar9);
          FxClassDefaults::FxClassDefaults
                    (this_00,this->classx,&(this->super_FxExpression).ScriptPosition);
          this->classx = (FxExpression *)0x0;
          local_28 = this_00;
          if (this != (FxStructMember *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          iVar4 = (*(local_28->super_FxExpression)._vptr_FxExpression[2])(local_28,x);
          this_local = (FxStructMember *)CONCAT44(extraout_var_00,iVar4);
        }
        else {
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "\'Default\' requires an actor type.");
          if (this != (FxStructMember *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = (FxStructMember *)0x0;
        }
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)this->classx->ValueType,
                                  PPointer::RegistrationInfo.MyClass);
        if (bVar3) {
          parentfield = (PField *)dyn_cast<PPointer>((DObject *)this->classx->ValueType);
          if (((PPointer *)parentfield == (PPointer *)0x0) ||
             (bVar3 = DObject::IsKindOf((DObject *)((PPointer *)parentfield)->PointedType,
                                        PStruct::RegistrationInfo.MyClass), !bVar3)) {
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "Member variable requires a struct or class object.");
            if (this != (FxStructMember *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
        }
        else {
          pPVar9 = PStruct::RegistrationInfo.MyClass;
          bVar3 = DObject::IsKindOf((DObject *)this->classx->ValueType,
                                    PStruct::RegistrationInfo.MyClass);
          if (bVar3) {
            if ((this->classx->ExprType == EFX_ClassMember) ||
               (this->classx->ExprType == EFX_StructMember)) {
              newfield = (PField *)this->classx[1].ScriptPosition.FileName.Chars;
              pPVar6 = (PField *)DObject::operator_new((DObject *)0x40,(size_t)pPVar9);
              FName::FName((FName *)((long)&x_1 + 4),
                           (FName *)&(this->membervar->super_PSymbol).super_PTypeBase.super_DObject.
                                     field_0x24);
              pPVar1 = this->membervar;
              PField::PField(pPVar6,(FName *)((long)&x_1 + 4),pPVar1->Type,
                             pPVar1->Flags | newfield->Flags,pPVar1->Offset + newfield->Offset,0);
              pPVar6->BitValue = this->membervar->BitValue;
              this->classx[1].ScriptPosition.FileName.Chars = (char *)pPVar6;
              this->classx->isresolved = false;
              local_50 = pPVar6;
              iVar4 = (*this->classx->_vptr_FxExpression[2])(this->classx,x);
              this->classx = (FxExpression *)0x0;
              return (FxExpression *)CONCAT44(extraout_var_01,iVar4);
            }
            if (this->classx->ExprType == EFX_GlobalVariable) {
              newfield_1 = (PField *)this->classx[1]._vptr_FxExpression;
              pPVar6 = (PField *)DObject::operator_new((DObject *)0x40,(size_t)pPVar9);
              FName::FName((FName *)((long)&x_2 + 4),
                           (FName *)&(this->membervar->super_PSymbol).super_PTypeBase.super_DObject.
                                     field_0x24);
              pPVar1 = this->membervar;
              PField::PField(pPVar6,(FName *)((long)&x_2 + 4),pPVar1->Type,
                             pPVar1->Flags | newfield_1->Flags,pPVar1->Offset + newfield_1->Offset,0
                            );
              pPVar6->BitValue = this->membervar->BitValue;
              this->classx[1]._vptr_FxExpression = (_func_int **)pPVar6;
              this->classx->isresolved = false;
              local_70 = pPVar6;
              iVar4 = (*this->classx->_vptr_FxExpression[2])(this->classx,x);
              this->classx = (FxExpression *)0x0;
              return (FxExpression *)CONCAT44(extraout_var_02,iVar4);
            }
            if (this->classx->ExprType == EFX_StackVariable) {
              newfield_2 = (PField *)this->classx[1]._vptr_FxExpression;
              pPVar6 = (PField *)DObject::operator_new((DObject *)0x40,(size_t)pPVar9);
              FName::FName((FName *)((long)&x_3 + 4),
                           (FName *)&(this->membervar->super_PSymbol).super_PTypeBase.super_DObject.
                                     field_0x24);
              pPVar1 = this->membervar;
              PField::PField(pPVar6,(FName *)((long)&x_3 + 4),pPVar1->Type,
                             pPVar1->Flags | newfield_2->Flags,pPVar1->Offset + newfield_2->Offset,0
                            );
              pPVar6->BitValue = this->membervar->BitValue;
              local_90 = pPVar6;
              FxStackVariable::ReplaceField((FxStackVariable *)this->classx,pPVar6);
              this->classx->isresolved = false;
              iVar4 = (*this->classx->_vptr_FxExpression[2])(this->classx,x);
              this->classx = (FxExpression *)0x0;
              return (FxExpression *)CONCAT44(extraout_var_03,iVar4);
            }
            if ((this->classx->ExprType == EFX_LocalVariable) &&
               (bVar3 = FxExpression::IsVector(this->classx), bVar3)) {
              pFVar2 = this->classx;
              *(int *)((long)&pFVar2[1].ScriptPosition.FileName.Chars + 4) =
                   (int)(this->membervar->Offset >> 3);
              pFVar2->ValueType = this->membervar->Type;
              this->classx = (FxExpression *)0x0;
              if (this == (FxStructMember *)0x0) {
                return pFVar2;
              }
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
              return pFVar2;
            }
            if ((this->classx->ExprType == EFX_LocalVariable) &&
               ((PStruct *)this->classx->ValueType == TypeColorStruct)) {
              iVar4 = FName::GetIndex((FName *)&(this->membervar->super_PSymbol).super_PTypeBase.
                                                super_DObject.field_0x24);
              switch(iVar4) {
              case 0x28f:
                x_4._4_4_ = 0x18;
                break;
              case 0x290:
                x_4._4_4_ = 0x10;
                break;
              case 0x291:
                x_4._4_4_ = 8;
                break;
              case 0x292:
              default:
                x_4._4_4_ = 0;
              }
              this->classx->ValueType = (PType *)TypeColor;
              pFVar2 = this->classx;
              local_b8 = pFVar2;
              if (x_4._4_4_ != 0) {
                local_b8 = (FxExpression *)
                           FxExpression::operator_new((FxExpression *)0x40,(size_t)pPVar9);
                pFVar7 = (FxConstant *)
                         FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar9);
                FxConstant::FxConstant(pFVar7,x_4._4_4_,&(this->super_FxExpression).ScriptPosition);
                pPVar9 = (PClass *)0x117;
                FxShift::FxShift((FxShift *)local_b8,0x117,pFVar2,(FxExpression *)pFVar7);
              }
              this_01 = (FxBitOp *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pPVar9);
              pFVar7 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar9)
              ;
              FxConstant::FxConstant(pFVar7,0xff,&(this->super_FxExpression).ScriptPosition);
              FxBitOp::FxBitOp(this_01,0x26,local_b8,(FxExpression *)pFVar7);
              this->classx = (FxExpression *)0x0;
              if (this != (FxStructMember *)0x0) {
                (*(this->super_FxExpression)._vptr_FxExpression[1])();
              }
              iVar4 = (*(this_01->super_FxBinary).super_FxExpression._vptr_FxExpression[2])
                                (this_01,x);
              return (FxExpression *)CONCAT44(extraout_var_04,iVar4);
            }
            uVar5 = (*this->classx->_vptr_FxExpression[4])(this->classx,x,&this->AddressWritable);
            if ((uVar5 & 1) == 0) {
              pcVar8 = FName::GetChars((FName *)&(this->membervar->super_PSymbol).super_PTypeBase.
                                                 super_DObject.field_0x24);
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,2,
                         "unable to dereference left side of %s",pcVar8);
              if (this != (FxStructMember *)0x0) {
                (*(this->super_FxExpression)._vptr_FxExpression[1])();
              }
              return (FxExpression *)0x0;
            }
          }
        }
        (this->super_FxExpression).ValueType = this->membervar->Type;
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxStructMember::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(classx, ctx);

	if (membervar->SymbolName == NAME_Default)
	{
		if (!classx->ValueType->IsKindOf(RUNTIME_CLASS(PPointer))
			|| !static_cast<PPointer *>(classx->ValueType)->PointedType->IsKindOf(RUNTIME_CLASS(AActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "'Default' requires an actor type.");
			delete this;
			return nullptr;
		}
		FxExpression * x = new FxClassDefaults(classx, ScriptPosition);
		classx = nullptr;
		delete this;
		return x->Resolve(ctx);
	}

	if (classx->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		PPointer *ptrtype = dyn_cast<PPointer>(classx->ValueType);
		if (ptrtype == nullptr || !ptrtype->PointedType->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			ScriptPosition.Message(MSG_ERROR, "Member variable requires a struct or class object.");
			delete this;
			return nullptr;
		}
	}
	else if (classx->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
	{
		// if this is a struct within a class or another struct we can simplify the expression by creating a new PField with a cumulative offset.
		if (classx->ExprType == EFX_ClassMember || classx->ExprType == EFX_StructMember)
		{
			auto parentfield = static_cast<FxStructMember *>(classx)->membervar;
			// PFields are garbage collected so this will be automatically taken care of later.
			auto newfield = new PField(membervar->SymbolName, membervar->Type, membervar->Flags | parentfield->Flags, membervar->Offset + parentfield->Offset);
			newfield->BitValue = membervar->BitValue;
			static_cast<FxStructMember *>(classx)->membervar = newfield;
			classx->isresolved = false;	// re-resolve the parent so it can also check if it can be optimized away.
			auto x = classx->Resolve(ctx);
			classx = nullptr;
			return x;
		}
		else if (classx->ExprType == EFX_GlobalVariable)
		{
			auto parentfield = static_cast<FxGlobalVariable *>(classx)->membervar;
			auto newfield = new PField(membervar->SymbolName, membervar->Type, membervar->Flags | parentfield->Flags, membervar->Offset + parentfield->Offset);
			newfield->BitValue = membervar->BitValue;
			static_cast<FxGlobalVariable *>(classx)->membervar = newfield;
			classx->isresolved = false;	// re-resolve the parent so it can also check if it can be optimized away.
			auto x = classx->Resolve(ctx);
			classx = nullptr;
			return x;
		}
		else if (classx->ExprType == EFX_StackVariable)
		{
			auto parentfield = static_cast<FxStackVariable *>(classx)->membervar;
			auto newfield = new PField(membervar->SymbolName, membervar->Type, membervar->Flags | parentfield->Flags, membervar->Offset + parentfield->Offset);
			newfield->BitValue = membervar->BitValue;
			static_cast<FxStackVariable *>(classx)->ReplaceField(newfield);
			classx->isresolved = false;	// re-resolve the parent so it can also check if it can be optimized away.
			auto x = classx->Resolve(ctx);
			classx = nullptr;
			return x;
		}
		else if (classx->ExprType == EFX_LocalVariable && classx->IsVector())	// vectors are a special case because they are held in registers
		{
			// since this is a vector, all potential things that may get here are single float or an xy-vector.
			auto locvar = static_cast<FxLocalVariable *>(classx);
			locvar->RegOffset = int(membervar->Offset / 8);
			locvar->ValueType = membervar->Type;
			classx = nullptr;
			delete this;
			return locvar;
		}
		else if (classx->ExprType == EFX_LocalVariable && classx->ValueType == TypeColorStruct)
		{
			// This needs special treatment because it'd require accessing the register via address.
			// Fortunately this is the only place where this kind of access is ever needed so an explicit handling is acceptable.
			int bits;
			switch (membervar->SymbolName.GetIndex())
			{
			case NAME_a: bits = 24; break;
			case NAME_r: bits = 16; break;
			case NAME_g: bits = 8; break;
			case NAME_b: default: bits = 0; break;
			}
			classx->ValueType = TypeColor;	// need to set it back.
			FxExpression *x = classx;
			if (bits > 0) x = new FxShift(TK_URShift, x, new FxConstant(bits, ScriptPosition));
			x = new FxBitOp('&', x, new FxConstant(255, ScriptPosition));
			classx = nullptr;
			delete this;
			return x->Resolve(ctx);
		}
		else
		{
			if (!(classx->RequestAddress(ctx, &AddressWritable)))
			{
				ScriptPosition.Message(MSG_ERROR, "unable to dereference left side of %s", membervar->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}
	ValueType = membervar->Type;
	return this;
}